

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O2

void Gia_ObjPrint(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  Gia_Obj_t *pGVar7;
  int *piVar8;
  Vec_Int_t *pVVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  long lVar13;
  
  if (pObj == (Gia_Obj_t *)0x0) {
    printf("Object is NULL.");
    return;
  }
  if (((ulong)pObj & 1) != 0) {
    printf("Compl ");
    pObj = (Gia_Obj_t *)((ulong)pObj & 0xfffffffffffffffe);
  }
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Gia_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaUtil.c"
                  ,0x51f,"void Gia_ObjPrint(Gia_Man_t *, Gia_Obj_t *)");
  }
  uVar1 = Gia_ObjId(p,pObj);
  printf("Obj %4d : ",(ulong)uVar1);
  uVar6 = *(ulong *)pObj;
  if ((~uVar6 & 0x1fffffff1fffffff) == 0) {
    pcVar10 = "constant 0";
LAB_0061a2a3:
    printf(pcVar10);
    goto LAB_0061a44c;
  }
  if (((uint)uVar6 & 0x9fffffff) == 0x9fffffff) {
    iVar3 = Gia_ObjCioId(pObj);
    if (iVar3 < p->vCis->nSize - p->nRegs) {
      pcVar10 = "PI";
      goto LAB_0061a2a3;
    }
    uVar6 = *(ulong *)pObj;
  }
  uVar1 = (uint)uVar6;
  if ((~uVar1 & 0x1fffffff) == 0 || -1 < (int)uVar1) {
LAB_0061a35e:
    if ((uVar1 & 0x9fffffff) == 0x9fffffff) {
      pGVar7 = Gia_ObjRoToRi(p,pObj);
      uVar1 = Gia_ObjFaninId0p(p,pGVar7);
      pGVar7 = Gia_ObjRoToRi(p,pObj);
      pcVar10 = "\'";
      if ((*(uint *)pGVar7 >> 0x1d & 1) == 0) {
        pcVar10 = " ";
      }
      pcVar11 = "RO( %4d%s )";
    }
    else {
      if ((~uVar1 & 0x1fffffff) == 0 || -1 < (int)uVar1) {
        iVar3 = Gia_ObjIsXor(pObj);
        if (iVar3 == 0) {
          iVar3 = Gia_ObjId(p,pObj);
          if ((p->pMuxes != (uint *)0x0) && (p->pMuxes[iVar3] != 0)) {
            uVar1 = Gia_ObjFaninId2p(p,pObj);
            iVar3 = Gia_ObjFaninC2(p,pObj);
            pcVar11 = "\'";
            pcVar10 = "\'";
            if (iVar3 == 0) {
              pcVar10 = " ";
            }
            uVar2 = Gia_ObjFaninId1p(p,pObj);
            pcVar12 = "\'";
            if (((undefined1  [12])*pObj & (undefined1  [12])0x2000000000000000) ==
                (undefined1  [12])0x0) {
              pcVar12 = " ";
            }
            uVar5 = Gia_ObjFaninId0p(p,pObj);
            if ((*(uint *)pObj >> 0x1d & 1) == 0) {
              pcVar11 = " ";
            }
            printf("MUX( %4d%s, %4d%s, %4d%s )",(ulong)uVar1,pcVar10,(ulong)uVar2,pcVar12,
                   (ulong)uVar5,pcVar11);
            goto LAB_0061a44c;
          }
          uVar1 = Gia_ObjFaninId0p(p,pObj);
          pcVar11 = "\'";
          pcVar10 = "\'";
          if ((*(uint *)pObj >> 0x1d & 1) == 0) {
            pcVar10 = " ";
          }
          uVar2 = Gia_ObjFaninId1p(p,pObj);
          if (((undefined1  [12])*pObj & (undefined1  [12])0x2000000000000000) ==
              (undefined1  [12])0x0) {
            pcVar11 = " ";
          }
          pcVar12 = "AND( %4d%s, %4d%s )";
        }
        else {
          uVar1 = Gia_ObjFaninId0p(p,pObj);
          pcVar11 = "\'";
          pcVar10 = "\'";
          if ((*(uint *)pObj >> 0x1d & 1) == 0) {
            pcVar10 = " ";
          }
          uVar2 = Gia_ObjFaninId1p(p,pObj);
          if ((*(ulong *)pObj >> 0x3d & 1) == 0) {
            pcVar11 = " ";
          }
          pcVar12 = "XOR( %4d%s, %4d%s )";
        }
        printf(pcVar12,(ulong)uVar1,pcVar10,(ulong)uVar2,pcVar11);
        goto LAB_0061a44c;
      }
      uVar1 = Gia_ObjFaninId0p(p,pObj);
      pcVar10 = "\'";
      if ((*(uint *)pObj >> 0x1d & 1) == 0) {
        pcVar10 = " ";
      }
      pcVar11 = "RI( %4d%s )";
    }
  }
  else {
    iVar3 = Gia_ObjCioId(pObj);
    if (p->vCos->nSize - p->nRegs <= iVar3) {
      uVar1 = (uint)*(undefined8 *)pObj;
      goto LAB_0061a35e;
    }
    uVar1 = Gia_ObjFaninId0p(p,pObj);
    pcVar10 = "\'";
    if ((*(uint *)pObj >> 0x1d & 1) == 0) {
      pcVar10 = " ";
    }
    pcVar11 = "PO( %4d%s )";
  }
  printf(pcVar11,(ulong)uVar1,pcVar10);
LAB_0061a44c:
  if (p->pRefs != (int *)0x0) {
    uVar1 = Gia_ObjRefNum(p,pObj);
    printf(" (refs = %3d)",(ulong)uVar1);
  }
  uVar6 = *(ulong *)pObj;
  if (((uint)uVar6 >> 0x1e & 1) != 0) {
    printf(" mark0");
    uVar6 = *(ulong *)pObj;
  }
  if ((uVar6 >> 0x3e & 1) != 0) {
    printf(" mark1");
  }
  if (p->vMapping != (Vec_Int_t *)0x0) {
    iVar3 = Gia_ObjId(p,pObj);
    iVar3 = Gia_ObjIsLut(p,iVar3);
    if (iVar3 != 0) {
      printf(" Cut = { ");
      lVar13 = 0;
      while( true ) {
        iVar3 = Gia_ObjId(p,pObj);
        iVar3 = Gia_ObjLutSize(p,iVar3);
        if (iVar3 <= lVar13) break;
        iVar3 = Gia_ObjId(p,pObj);
        piVar8 = Gia_ObjLutFanins(p,iVar3);
        printf("%d ",(ulong)(uint)piVar8[lVar13]);
        lVar13 = lVar13 + 1;
      }
      putchar(0x7d);
    }
  }
  if (p->vMapping2 != (Vec_Wec_t *)0x0) {
    iVar3 = Gia_ObjId(p,pObj);
    pVVar9 = Vec_WecEntry(p->vMapping2,iVar3);
    if (pVVar9->nSize != 0) {
      printf(" Cut = { ");
      iVar3 = 0;
      while( true ) {
        iVar4 = Gia_ObjId(p,pObj);
        pVVar9 = Vec_WecEntry(p->vMapping2,iVar4);
        if (pVVar9->nSize <= iVar3) break;
        iVar4 = Gia_ObjId(p,pObj);
        pVVar9 = Vec_WecEntry(p->vMapping2,iVar4);
        uVar1 = Vec_IntEntry(pVVar9,iVar3);
        printf("%d ",(ulong)uVar1);
        iVar3 = iVar3 + 1;
      }
      putchar(0x7d);
    }
  }
  putchar(10);
  return;
}

Assistant:

void Gia_ObjPrint( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    if ( pObj == NULL )
    {
        printf( "Object is NULL." );
        return;
    }
    if ( Gia_IsComplement(pObj) )
    {
        printf( "Compl " );
        pObj = Gia_Not(pObj);
    }
    assert( !Gia_IsComplement(pObj) );
    printf( "Obj %4d : ", Gia_ObjId(p, pObj) );
    if ( Gia_ObjIsConst0(pObj) )
        printf( "constant 0" );
    else if ( Gia_ObjIsPi(p, pObj) )
        printf( "PI" );
    else if ( Gia_ObjIsPo(p, pObj) )
        printf( "PO( %4d%s )", Gia_ObjFaninId0p(p, pObj), (Gia_ObjFaninC0(pObj)? "\'" : " ") );
    else if ( Gia_ObjIsCi(pObj) )
        printf( "RO( %4d%s )", Gia_ObjFaninId0p(p, Gia_ObjRoToRi(p, pObj)), (Gia_ObjFaninC0(Gia_ObjRoToRi(p, pObj))? "\'" : " ") );
    else if ( Gia_ObjIsCo(pObj) )
        printf( "RI( %4d%s )", Gia_ObjFaninId0p(p, pObj), (Gia_ObjFaninC0(pObj)? "\'" : " ") );
//    else if ( Gia_ObjIsBuf(pObj) )
//        printf( "BUF( %d%s )", Gia_ObjFaninId0p(p, pObj), (Gia_ObjFaninC0(pObj)? "\'" : " ") );
    else if ( Gia_ObjIsXor(pObj) )
        printf( "XOR( %4d%s, %4d%s )", 
            Gia_ObjFaninId0p(p, pObj), (Gia_ObjFaninC0(pObj)? "\'" : " "), 
            Gia_ObjFaninId1p(p, pObj), (Gia_ObjFaninC1(pObj)? "\'" : " ") );
    else if ( Gia_ObjIsMuxId(p, Gia_ObjId(p, pObj)) )
        printf( "MUX( %4d%s, %4d%s, %4d%s )", 
            Gia_ObjFaninId2p(p, pObj), (Gia_ObjFaninC2(p, pObj)? "\'" : " "), 
            Gia_ObjFaninId1p(p, pObj), (Gia_ObjFaninC1(pObj)? "\'" : " "), 
            Gia_ObjFaninId0p(p, pObj), (Gia_ObjFaninC0(pObj)? "\'" : " ") );
    else
        printf( "AND( %4d%s, %4d%s )", 
            Gia_ObjFaninId0p(p, pObj), (Gia_ObjFaninC0(pObj)? "\'" : " "), 
            Gia_ObjFaninId1p(p, pObj), (Gia_ObjFaninC1(pObj)? "\'" : " ") );
    if ( p->pRefs )
        printf( " (refs = %3d)", Gia_ObjRefNum(p, pObj) );
    if ( pObj->fMark0 )
        printf( " mark0" );
    if ( pObj->fMark1 )
        printf( " mark1" );
    if ( Gia_ManHasMapping(p) && Gia_ObjIsLut(p, Gia_ObjId(p, pObj)) )
    {
        int i, iFan;
        printf( " Cut = { " );
        Gia_LutForEachFanin( p, Gia_ObjId(p, pObj), iFan, i )
            printf( "%d ", iFan );
        printf( "}" );
    }
    if ( Gia_ManHasMapping2(p) && Gia_ObjIsLut2(p, Gia_ObjId(p, pObj)) )
    {
        int i, iFan;
        printf( " Cut = { " );
        Gia_LutForEachFanin2( p, Gia_ObjId(p, pObj), iFan, i )
            printf( "%d ", iFan );
        printf( "}" );
    }
    printf( "\n" );
/*
    if ( p->pRefs )
    {
        Gia_Obj_t * pFanout;
        int i;
        int iFan = -1; // Suppress "might be used uninitialized"
        printf( "\nFanouts:\n" );
        Gia_ObjForEachFanout( p, pObj, pFanout, iFan, i )
        {
            printf( "    " );
            printf( "Node %4d : ", Gia_ObjId(pFanout) );
            if ( Gia_ObjIsPo(pFanout) )
                printf( "PO( %4d%s )", Gia_ObjFanin0(pFanout)->Id, (Gia_ObjFaninC0(pFanout)? "\'" : " ") );
            else if ( Gia_ObjIsBuf(pFanout) )
                printf( "BUF( %d%s )", Gia_ObjFanin0(pFanout)->Id, (Gia_ObjFaninC0(pFanout)? "\'" : " ") );
            else
                printf( "AND( %4d%s, %4d%s )", 
                    Gia_ObjFanin0(pFanout)->Id, (Gia_ObjFaninC0(pFanout)? "\'" : " "), 
                    Gia_ObjFanin1(pFanout)->Id, (Gia_ObjFaninC1(pFanout)? "\'" : " ") );
            printf( "\n" );
        }
        return;
    }
*/
}